

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysextest.cpp
# Opt level: O3

bool chooseMidiPort(RtMidi *rtmidi)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  ostream *poVar5;
  undefined8 uVar6;
  char *pcVar7;
  string portName;
  string keyHit;
  bool local_99;
  uint local_98;
  long *local_90;
  long local_88;
  long local_80 [2];
  char *local_70;
  long local_68;
  char local_60;
  undefined7 uStack_5f;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  if (rtmidi != (RtMidi *)0x0) {
    pcVar7 = *(char **)(*(long *)(*(long *)rtmidi + -8) + 8);
    if ((pcVar7 == ___cxa_begin_catch) ||
       ((*pcVar7 != '*' && (iVar3 = strcmp(pcVar7,___cxa_begin_catch), iVar3 == 0)))) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nWould you like to open a virtual input port? [y/N] ",0x34)
      ;
      bVar1 = 1;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nWould you like to open a virtual output port? [y/N] ",0x35
                );
      bVar1 = 0;
    }
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    cVar2 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + '0');
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&local_50,cVar2);
    iVar3 = std::__cxx11::string::compare((char *)&local_50);
    if (iVar3 == 0) {
      local_70 = &local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"RtMidi","");
      (**(code **)(*(long *)rtmidi + 8))(rtmidi,&local_70);
      if (local_70 != &local_60) {
        operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
      }
      local_99 = true;
    }
    else {
      local_70 = &local_60;
      local_68 = 0;
      local_60 = '\0';
      local_98 = 0;
      uVar4 = (**(code **)(*(long *)rtmidi + 0x10))(rtmidi);
      local_99 = uVar4 != 0;
      if (uVar4 == 0) {
        pcVar7 = "No output ports available!";
        if (bVar1 != 0) {
          pcVar7 = "No input ports available!";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,pcVar7,0x1a - (ulong)bVar1);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
        std::ostream::put(-0x58);
        std::ostream::flush();
      }
      else {
        if (uVar4 == 1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nOpening ",9);
          (**(code **)(*(long *)rtmidi + 0x18))(&local_90,rtmidi,0);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)local_90,local_88);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          if (local_90 != local_80) {
            operator_delete(local_90,local_80[0] + 1);
          }
        }
        else {
          local_98 = 0;
          do {
            (**(code **)(*(long *)rtmidi + 0x18))((string *)&local_90,rtmidi,local_98);
            std::__cxx11::string::operator=((string *)&local_70,(string *)&local_90);
            if (local_90 != local_80) {
              operator_delete(local_90,local_80[0] + 1);
            }
            if (bVar1 == 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"  Output port #",0xf);
              poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_70,local_68);
              local_90 = (long *)CONCAT71(local_90._1_7_,10);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_90,1);
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"  Input port #",0xe);
              poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_70,local_68);
              local_90 = (long *)CONCAT71(local_90._1_7_,10);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_90,1);
            }
            local_98 = local_98 + 1;
          } while (local_98 < uVar4);
          do {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\nChoose a port number: ",0x17);
            std::istream::_M_extract<unsigned_int>((uint *)&std::cin);
          } while (uVar4 <= local_98);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
        std::ostream::put(-0x58);
        std::ostream::flush();
        local_90 = local_80;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"RtMidi","");
        (*(code *)**(undefined8 **)rtmidi)(rtmidi,local_98,&local_90);
        if (local_90 != local_80) {
          operator_delete(local_90,local_80[0] + 1);
        }
      }
      if (local_70 != &local_60) {
        operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
      }
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    return local_99;
  }
  uVar6 = __cxa_bad_typeid();
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  _Unwind_Resume(uVar6);
}

Assistant:

bool chooseMidiPort( RtMidi *rtmidi )
{
  bool isInput = false;
  if ( typeid( *rtmidi ) == typeid( RtMidiIn ) )
    isInput = true;

  if ( isInput )
    std::cout << "\nWould you like to open a virtual input port? [y/N] ";
  else
    std::cout << "\nWould you like to open a virtual output port? [y/N] ";

  std::string keyHit;
  std::getline( std::cin, keyHit );
  if ( keyHit == "y" ) {
    rtmidi->openVirtualPort();
    return true;
  }

  std::string portName;
  unsigned int i = 0, nPorts = rtmidi->getPortCount();
  if ( nPorts == 0 ) {
    if ( isInput )
      std::cout << "No input ports available!" << std::endl;
    else
      std::cout << "No output ports available!" << std::endl;
    return false;
  }

  if ( nPorts == 1 ) {
    std::cout << "\nOpening " << rtmidi->getPortName() << std::endl;
  }
  else {
    for ( i=0; i<nPorts; i++ ) {
      portName = rtmidi->getPortName(i);
      if ( isInput )
        std::cout << "  Input port #" << i << ": " << portName << '\n';
      else
        std::cout << "  Output port #" << i << ": " << portName << '\n';
    }

    do {
      std::cout << "\nChoose a port number: ";
      std::cin >> i;
    } while ( i >= nPorts );
  }

  std::cout << std::endl;
  rtmidi->openPort( i );

  return true;
}